

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O2

void start_pass_main(j_decompress_ptr cinfo,J_BUF_MODE pass_mode)

{
  int iVar1;
  jpeg_d_main_controller *pjVar2;
  undefined8 *puVar3;
  long lVar4;
  _func_void_j_decompress_ptr_J_BUF_MODE *p_Var5;
  undefined8 uVar6;
  jpeg_error_mgr *pjVar7;
  int iVar8;
  ulong uVar9;
  my_main_ptr main_ptr;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  jpeg_component_info *pjVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  
  pjVar2 = cinfo->main;
  if (pass_mode == JBUF_CRANK_DEST) {
    pjVar2->process_data = process_data_crank_post;
    return;
  }
  if (pass_mode == JBUF_PASS_THRU) {
    if (cinfo->upsample->need_context_rows == 0) {
      pjVar2->process_data = process_data_simple_main;
    }
    else {
      pjVar2->process_data = process_data_context_main;
      iVar1 = cinfo->min_DCT_scaled_size;
      pjVar13 = cinfo->comp_info;
      uVar16 = 0;
      uVar12 = (ulong)(uint)cinfo->num_components;
      if (cinfo->num_components < 1) {
        uVar12 = uVar16;
      }
      for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
        uVar9 = (long)(pjVar13->DCT_scaled_size * pjVar13->v_samp_factor) / (long)iVar1;
        puVar3 = *(undefined8 **)(pjVar2[6].process_data + uVar10 * 8);
        lVar4 = *(long *)(pjVar2[7].start_pass + uVar10 * 8);
        p_Var5 = (&pjVar2[1].start_pass)[uVar10];
        iVar8 = (int)uVar9;
        uVar17 = iVar8 * (iVar1 + 2);
        uVar15 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar15 = uVar16;
        }
        for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
          uVar6 = *(undefined8 *)(p_Var5 + uVar14 * 8);
          *(undefined8 *)(lVar4 + uVar14 * 8) = uVar6;
          puVar3[uVar14] = uVar6;
        }
        lVar11 = (long)(iVar8 * (iVar1 + -2));
        uVar15 = (ulong)(uint)(iVar8 * 2);
        if (iVar8 * 2 < 1) {
          uVar15 = uVar16;
        }
        for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
          *(undefined8 *)(lVar4 + lVar11 * 8 + uVar14 * 8) =
               *(undefined8 *)(p_Var5 + uVar14 * 8 + (long)(iVar8 * iVar1) * 8);
          *(undefined8 *)(lVar4 + (long)(iVar8 * iVar1) * 8 + uVar14 * 8) =
               *(undefined8 *)(p_Var5 + uVar14 * 8 + lVar11 * 8);
        }
        uVar9 = uVar9 & 0xffffffff;
        if (iVar8 < 1) {
          uVar9 = uVar16;
        }
        for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
          puVar3[uVar15 - (long)iVar8] = *puVar3;
        }
        pjVar13 = pjVar13 + 1;
      }
      pjVar2[7].process_data =
           (_func_void_j_decompress_ptr_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION *)0x0;
      *(undefined4 *)((long)&pjVar2[8].start_pass + 4) = 0;
    }
    pjVar2[6].start_pass = (_func_void_j_decompress_ptr_J_BUF_MODE *)0x0;
    return;
  }
  pjVar7 = cinfo->err;
  pjVar7->msg_code = 4;
  (*pjVar7->error_exit)((j_common_ptr)cinfo);
  return;
}

Assistant:

METHODDEF(void)
start_pass_main(j_decompress_ptr cinfo, J_BUF_MODE pass_mode)
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;

  switch (pass_mode) {
  case JBUF_PASS_THRU:
    if (cinfo->upsample->need_context_rows) {
      main_ptr->pub.process_data = process_data_context_main;
      make_funny_pointers(cinfo); /* Create the xbuffer[] lists */
      main_ptr->whichptr = 0;   /* Read first iMCU row into xbuffer[0] */
      main_ptr->context_state = CTX_PREPARE_FOR_IMCU;
      main_ptr->iMCU_row_ctr = 0;
    } else {
      /* Simple case with no context needed */
      main_ptr->pub.process_data = process_data_simple_main;
    }
    main_ptr->buffer_full = FALSE;      /* Mark buffer empty */
    main_ptr->rowgroup_ctr = 0;
    break;
#ifdef QUANT_2PASS_SUPPORTED
  case JBUF_CRANK_DEST:
    /* For last pass of 2-pass quantization, just crank the postprocessor */
    main_ptr->pub.process_data = process_data_crank_post;
    break;
#endif
  default:
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    break;
  }
}